

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

FieldEntry *
google::protobuf::internal::TcParser::FindFieldEntry(TcParseTableBase *table,uint32_t field_num)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  type_conflict tVar5;
  FieldEntry *pFVar6;
  ushort *puVar7;
  FieldEntry *entry_1;
  uint16_t skipbit_1;
  uint32_t skipmap_1;
  SkipEntry16 se;
  uint16_t *skip_data;
  uint32_t skip_num;
  uint32_t num_skip_entries;
  uint16_t *lookup_table;
  FieldEntry *entry;
  uint32_t skipbit;
  uint32_t skipmap;
  uint32_t adj_fnum;
  uint32_t fstart;
  FieldEntry *field_entries;
  uint32_t field_num_local;
  TcParseTableBase *table_local;
  
  pFVar6 = TcParseTableBase::field_entries_begin(table);
  uVar3 = field_num - 1;
  if (uVar3 < 0x20) {
    uVar4 = 1 << ((byte)uVar3 & 0x1f);
    if ((table->skipmap32 & uVar4) == 0) {
      tVar5 = absl::lts_20250127::popcount<unsigned_int>(uVar4 - 1 & table->skipmap32);
      table_local = (TcParseTableBase *)(pFVar6 + (uVar3 - tVar5));
      if (table_local == (TcParseTableBase *)0x0) {
        protobuf_assumption_failed
                  ("entry != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x109);
      }
    }
    else {
      table_local = (TcParseTableBase *)0x0;
    }
  }
  else {
    _skip_num = (uint *)TcParseTableBase::field_lookup_begin(table);
    while( true ) {
      if (field_num < *_skip_num) break;
      uVar3 = field_num - *_skip_num;
      if (uVar3 >> 4 < (uint)(ushort)_skip_num[1]) {
        puVar7 = (ushort *)((long)_skip_num + (ulong)(uVar3 >> 4) * 4 + 6);
        uVar1 = *puVar7;
        uVar2 = puVar7[1];
        uVar4 = 1 << (sbyte)(uVar3 & 0xf);
        if ((uVar1 & (ushort)uVar4) != 0) {
          return (FieldEntry *)0x0;
        }
        tVar5 = absl::lts_20250127::popcount<unsigned_int>((uVar4 & 0xffff) - 1 & (uint)uVar1);
        if (pFVar6 + (((uint)uVar2 + (uVar3 & 0xf)) - tVar5) != (FieldEntry *)0x0) {
          return pFVar6 + (((uint)uVar2 + (uVar3 & 0xf)) - tVar5);
        }
        protobuf_assumption_failed
                  ("entry != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x127);
      }
      _skip_num = (uint *)((long)_skip_num + (ulong)(uint)(ushort)_skip_num[1] * 4 + 6);
    }
    table_local = (TcParseTableBase *)0x0;
  }
  return (FieldEntry *)table_local;
}

Assistant:

const TcParseTableBase::FieldEntry* TcParser::FindFieldEntry(
    const TcParseTableBase* table, uint32_t field_num) {
  const FieldEntry* const field_entries = table->field_entries_begin();

  uint32_t fstart = 1;
  uint32_t adj_fnum = field_num - fstart;

  if (ABSL_PREDICT_TRUE(adj_fnum < 32)) {
    uint32_t skipmap = table->skipmap32;
    uint32_t skipbit = 1 << adj_fnum;
    if (ABSL_PREDICT_FALSE(skipmap & skipbit)) return nullptr;
    skipmap &= skipbit - 1;
    adj_fnum -= absl::popcount(skipmap);
    auto* entry = field_entries + adj_fnum;
    PROTOBUF_ASSUME(entry != nullptr);
    return entry;
  }
  const uint16_t* lookup_table = table->field_lookup_begin();
  for (;;) {
#ifdef ABSL_IS_LITTLE_ENDIAN
    memcpy(&fstart, lookup_table, sizeof(fstart));
#else
    fstart = lookup_table[0] | (lookup_table[1] << 16);
#endif
    lookup_table += sizeof(fstart) / sizeof(*lookup_table);
    uint32_t num_skip_entries = *lookup_table++;
    if (field_num < fstart) return nullptr;
    adj_fnum = field_num - fstart;
    uint32_t skip_num = adj_fnum / 16;
    if (ABSL_PREDICT_TRUE(skip_num < num_skip_entries)) {
      // for each group of 16 fields we have:
      // a bitmap of 16 bits
      // a 16-bit field-entry offset for the first of them.
      auto* skip_data = lookup_table + (adj_fnum / 16) * (sizeof(SkipEntry16) /
                                                          sizeof(uint16_t));
      SkipEntry16 se = {skip_data[0], skip_data[1]};
      adj_fnum &= 15;
      uint32_t skipmap = se.skipmap;
      uint16_t skipbit = 1 << adj_fnum;
      if (ABSL_PREDICT_FALSE(skipmap & skipbit)) return nullptr;
      skipmap &= skipbit - 1;
      adj_fnum += se.field_entry_offset;
      adj_fnum -= absl::popcount(skipmap);
      auto* entry = field_entries + adj_fnum;
      PROTOBUF_ASSUME(entry != nullptr);
      return entry;
    }
    lookup_table +=
        num_skip_entries * (sizeof(SkipEntry16) / sizeof(*lookup_table));
  }
}